

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineLibraryCreateInfoKHR *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,bool in_pnext_chain,
               Value *out_value)

{
  bool bVar1;
  ulong uVar2;
  Value library_info;
  Value libraries;
  Value nexts;
  Data local_98;
  Data local_88;
  Number *local_70;
  Data local_68;
  Data local_58;
  StringRefType local_40;
  
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_88.n = (Number)0x0;
  local_88.s.str = (Ch *)0x4000000000000;
  local_70 = (Number *)out_value;
  if (create_info->libraryCount != 0) {
    uVar2 = 0;
    do {
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)&local_68.s,(uint64_t)create_info->pLibraries[uVar2],alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_88.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_68.s,alloc);
      uVar2 = uVar2 + 1;
    } while (uVar2 < create_info->libraryCount);
  }
  local_68.s.str = (Ch *)0x405000000151757;
  local_68.n = (Number)0x9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,alloc);
  if (in_pnext_chain) {
    local_40.s = "sType";
    local_40.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkStructureType>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_98.s,&local_40,create_info->sType,alloc);
  }
  else if (create_info->pNext != (void *)0x0) {
    local_58.n = (Number)0x0;
    local_58.s.str = (Ch *)0x0;
    bVar1 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (create_info->pNext,alloc,(Value *)&local_58.s,(DynamicStateInfo *)0x0);
    if (!bVar1) {
      return false;
    }
    local_68.s.str = (Ch *)0x405000000150c9d;
    local_68.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_58.s,alloc);
  }
  if (&local_98 != (Data *)local_70) {
    *local_70 = local_98.n;
    local_70[1] = (Number)local_98.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkPipelineLibraryCreateInfoKHR &create_info, Allocator &alloc,
                       bool in_pnext_chain, Value *out_value)
{
	Value library_info(kObjectType);
	Value libraries(kArrayType);
	for (uint32_t i = 0; i < create_info.libraryCount; i++)
		libraries.PushBack(uint64_string(api_object_cast<uint64_t>(create_info.pLibraries[i]), alloc), alloc);
	library_info.AddMember("libraries", libraries, alloc);

	if (in_pnext_chain)
	{
		library_info.AddMember("sType", create_info.sType, alloc);
	}
	else
	{
		if (!pnext_chain_add_json_value(library_info, create_info, alloc, nullptr))
			return false;
	}

	*out_value = library_info;
	return true;
}